

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

bool __thiscall tlx::CmdlineParser::ArgumentInt::process(ArgumentInt *this,int *argc,char ***argv)

{
  bool bVar1;
  char *in_RAX;
  long lVar2;
  char *endptr;
  
  if (*argc != 0) {
    endptr = in_RAX;
    lVar2 = strtol(**argv,&endptr,10);
    if ((endptr == (char *)0x0) || (0x7fffffff < lVar2 || *endptr != '\0')) {
      bVar1 = false;
    }
    else {
      *argc = *argc + -1;
      *argv = *argv + 1;
      *this->dest_ = (int)lVar2;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        char* endptr;
        long x = strtol(argv[0], &endptr, 10);
        if (endptr != nullptr && *endptr == 0 &&
            x <= std::numeric_limits<int>::max()) {
            --argc, ++argv;
            dest_ = static_cast<int>(x);
            return true;
        }
        else {
            return false;
        }
    }